

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AActor_A_SetChaseThreshold
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  PClass *pPVar2;
  int iVar3;
  undefined4 extraout_var;
  PClass *pPVar4;
  VMValue *pVVar5;
  AActor *pAVar6;
  int iVar7;
  char *pcVar8;
  bool bVar9;
  
  pPVar2 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar8 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      pAVar6 = (AActor *)(param->field_0).field_1.a;
      if (pAVar6 != (AActor *)0x0) {
        if ((pAVar6->super_DThinker).super_DObject.Class == (PClass *)0x0) {
          iVar3 = (**(pAVar6->super_DThinker).super_DObject._vptr_DObject)(pAVar6);
          (pAVar6->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar3);
        }
        pPVar4 = (pAVar6->super_DThinker).super_DObject.Class;
        bVar9 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar2 && bVar9) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar9 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar2) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (!bVar9) {
          pcVar8 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_003e10fd;
        }
      }
      if (numparam == 1) {
        pcVar8 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          iVar3 = param[1].field_0.i;
          if (numparam < 3) {
            pVVar5 = defaultparam->Array;
            if (pVVar5[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
              goto LAB_003e111c;
            }
          }
          else {
            pVVar5 = param;
            if (param[2].field_0.field_3.Type != '\0') {
              pcVar8 = "(param[paramnum]).Type == REGT_INT";
LAB_003e111c:
              __assert_fail(pcVar8,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                            ,0x1958,
                            "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
          }
          iVar1 = pVVar5[2].field_0.i;
          if (numparam < 4) {
            param = defaultparam->Array;
            if (param[3].field_0.field_3.Type == '\0') goto LAB_003e107f;
            pcVar8 = "(defaultparam[paramnum]).Type == REGT_INT";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
LAB_003e107f:
              pAVar6 = COPY_AAPTR(pAVar6,param[3].field_0.i);
              if (pAVar6 != (AActor *)0x0) {
                iVar7 = 0;
                if (0 < iVar3) {
                  iVar7 = iVar3;
                }
                if (iVar1 == 0) {
                  pAVar6->threshold = iVar7;
                }
                else {
                  pAVar6->DefThreshold = iVar7;
                }
              }
              return 0;
            }
            pcVar8 = "(param[paramnum]).Type == REGT_INT";
          }
          __assert_fail(pcVar8,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x1959,
                        "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar8 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar8,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                    ,0x1957,
                    "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    pcVar8 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_003e10fd:
  __assert_fail(pcVar8,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x1956,
                "int AF_AActor_A_SetChaseThreshold(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_SetChaseThreshold)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_INT(threshold);
	PARAM_BOOL_DEF(def);
	PARAM_INT_DEF(ptr);


	AActor *mobj = COPY_AAPTR(self, ptr);
	if (!mobj)
	{
		return 0;
	}
	if (def)
		mobj->DefThreshold = (threshold >= 0) ? threshold : 0;
	else
		mobj->threshold = (threshold >= 0) ? threshold : 0;
	return 0;
}